

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddDependencySchemaError
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,SValue *sourceName,ISchemaValidator *subvalidator)

{
  CrtAllocator *pCVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> GStack_28;
  
  pCVar1 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericValue<rapidjson::CrtAllocator>(&GStack_28,sourceName,pCVar1,false);
  pCVar1 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,&GStack_28,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(subvalidator + 0x13),
             pCVar1);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&GStack_28);
  return;
}

Assistant:

void AddDependencySchemaError(const SValue& sourceName, ISchemaValidator* subvalidator) {
        currentError_.AddMember(ValueType(sourceName, GetStateAllocator()).Move(),
            static_cast<GenericSchemaValidator*>(subvalidator)->GetError(), GetStateAllocator());
    }